

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_pars.h
# Opt level: O2

void lowmc_compute(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,mzd_local_t *y)

{
  uint uVar1;
  long lVar2;
  lowmc_partial_round_t *plVar3;
  byte bVar4;
  mzd_local_t mStack_140;
  mzd_local_t mStack_120;
  mzd_local_t mStack_100;
  mzd_local_t mStack_e0;
  mzd_local_t *pmStack_a8;
  mzd_local_t mStack_a0;
  mzd_local_t amStack_80 [2];
  
  uVar1 = (uint)lowmc->m | (uint)lowmc->n << 0x10;
  pmStack_a8 = y;
  if ((~DAT_0019408c & 0x20400) != 0) {
    if (uVar1 == 0x100000a) {
      mzd_xor_s128_256(&mStack_140,x,precomputed_constant_linear_part);
      plVar3 = rounds;
      mzd_addmul_v_s128_256(&mStack_140,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s128_256_1280(&mStack_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s128_1280(&mStack_100,&mStack_100,precomputed_constant_non_linear_part);
      bVar4 = 0;
      for (uVar1 = 0; uVar1 != 0x25; uVar1 = uVar1 + 1) {
        sbox_layer_10_uint64(mStack_140.w64 + 3);
        mStack_140.w64[3] =
             mStack_140.w64[3] ^
             *(long *)((long)(&mStack_100)[uVar1 >> 3].w64 + (ulong)(uVar1 & 6) * 4) <<
             (~bVar4 & 0x20) & 0xffffffff00000000U;
        mzd_mul_v_parity_uint64_256_30(&mStack_120,&mStack_140,plVar3->z_matrix);
        mzd_shuffle_256_30(&mStack_140,plVar3->r_mask);
        mzd_addmul_v_s128_30_256(&mStack_120,&mStack_140,plVar3->r_matrix);
        mStack_140.w64[3] = mStack_140.w64[3] & 0x3ffffffff;
        mzd_xor_s128_256(&mStack_140,&mStack_120,&mStack_140);
        plVar3 = plVar3 + 1;
        bVar4 = bVar4 + 0x20;
      }
      sbox_layer_10_uint64(mStack_140.w64 + 3);
      mStack_140.w64[3] = mStack_140.w64[3] ^ amStack_80[0].w64[2] & 0xffffffff00000000;
      mzd_mul_v_s128_256(&mStack_120,&mStack_140,Z_r);
      mzd_copy_s128_256(&mStack_140,&mStack_120);
      mzd_copy_s128_256(y,&mStack_140);
      return;
    }
    if (uVar1 == 0x81002b) {
      mStack_e0.w64[3] = 0x1056d0;
      mzd_copy_s128_256(&mStack_a0,x);
      mStack_e0.w64[3] = 0x1056e9;
      mzd_addmul_v_s128_129(&mStack_a0,key,K_0);
      for (lVar2 = 0; (int)lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
        mStack_e0.w64[3] = 0x105700;
        sbox_s128_lowmc_129_129_4(&mStack_a0);
        mStack_e0.w64[3] = 0x105710;
        mzd_mul_v_s128_129(amStack_80,&mStack_a0,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar2));
        mStack_e0.w64[3] = 0x105720;
        mzd_xor_s128_256(&mStack_a0,amStack_80,*(mzd_local_t **)((long)&rounds[0].constant + lVar2))
        ;
        mStack_e0.w64[3] = 0x105730;
        mzd_addmul_v_s128_129(&mStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar2));
      }
      mStack_e0.w64[3] = 0x105745;
      mzd_copy_s128_256(pmStack_a8,&mStack_a0);
      return;
    }
    if (uVar1 == 0xc0000a) {
      mStack_140.w64[3] = (word)y;
      mzd_xor_s128_256(&mStack_120,x,precomputed_constant_linear_part);
      plVar3 = rounds;
      mzd_addmul_v_s128_192(&mStack_120,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s128_192_1024(&mStack_e0,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s128_1024(&mStack_e0,&mStack_e0,precomputed_constant_non_linear_part);
      bVar4 = 0;
      for (uVar1 = 0; uVar1 != 0x1d; uVar1 = uVar1 + 1) {
        sbox_layer_10_uint64(mStack_120.w64 + 2);
        mStack_120.w64[2] =
             mStack_120.w64[2] ^
             *(long *)((long)(&mStack_e0)[uVar1 >> 3].w64 + (ulong)(uVar1 & 6) * 4) <<
             (~bVar4 & 0x20) & 0xffffffff00000000U;
        mzd_mul_v_parity_uint64_192_30(&mStack_100,&mStack_120,plVar3->z_matrix);
        mzd_shuffle_192_30(&mStack_120,plVar3->r_mask);
        mzd_addmul_v_s128_30_192(&mStack_100,&mStack_120,plVar3->r_matrix);
        mStack_120.w64[2] = mStack_120.w64[2] & 0x3ffffffff;
        mzd_xor_s128_256(&mStack_120,&mStack_100,&mStack_120);
        plVar3 = plVar3 + 1;
        bVar4 = bVar4 + 0x20;
      }
      sbox_layer_10_uint64(mStack_120.w64 + 2);
      mStack_120.w64[2] = mStack_120.w64[2] ^ amStack_80[0].w64[2] & 0xffffffff00000000;
      mzd_mul_v_s128_192(&mStack_100,&mStack_120,Z_r);
      mzd_copy_s128_256(&mStack_120,&mStack_100);
      mzd_copy_s128_256((mzd_local_t *)mStack_140.w64[3],&mStack_120);
      return;
    }
    if (uVar1 != 0xc00040) {
      if (uVar1 != 0xff0055) {
        lowmc_s128_lowmc_128_128_20(key,x,y);
        return;
      }
      mStack_e0.w64[3] = 0x105832;
      mzd_copy_s128_256(&mStack_a0,x);
      mStack_e0.w64[3] = 0x10584b;
      mzd_addmul_v_s128_256(&mStack_a0,key,K_0);
      for (lVar2 = 0; (int)lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
        mStack_e0.w64[3] = 0x105862;
        sbox_s128_lowmc_255_255_4(&mStack_a0);
        mStack_e0.w64[3] = 0x105872;
        mzd_mul_v_s128_256(amStack_80,&mStack_a0,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar2));
        mStack_e0.w64[3] = 0x105882;
        mzd_xor_s128_256(&mStack_a0,amStack_80,*(mzd_local_t **)((long)&rounds[0].constant + lVar2))
        ;
        mStack_e0.w64[3] = 0x105892;
        mzd_addmul_v_s128_256(&mStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar2));
      }
      mStack_e0.w64[3] = 0x1058a7;
      mzd_copy_s128_256(pmStack_a8,&mStack_a0);
      return;
    }
    mStack_e0.w64[3] = 0x105781;
    mzd_copy_s128_256(&mStack_a0,x);
    mStack_e0.w64[3] = 0x10579a;
    mzd_addmul_v_s128_192(&mStack_a0,key,K_0);
    for (lVar2 = 0; (int)lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
      mStack_e0.w64[3] = 0x1057b1;
      sbox_s128_lowmc_192_192_4(&mStack_a0);
      mStack_e0.w64[3] = 0x1057c1;
      mzd_mul_v_s128_192(amStack_80,&mStack_a0,*(mzd_local_t **)((long)&rounds[0].l_matrix + lVar2))
      ;
      mStack_e0.w64[3] = 0x1057d1;
      mzd_xor_s128_256(&mStack_a0,amStack_80,*(mzd_local_t **)((long)&rounds[0].constant + lVar2));
      mStack_e0.w64[3] = 0x1057e1;
      mzd_addmul_v_s128_192(&mStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar2));
    }
    mStack_e0.w64[3] = 0x1057f6;
    mzd_copy_s128_256(pmStack_a8,&mStack_a0);
    return;
  }
  if (uVar1 == 0x100000a) {
    mzd_xor_s256_256(&mStack_140,x,precomputed_constant_linear_part);
    plVar3 = rounds;
    mzd_addmul_v_s256_256(&mStack_140,key,precomputed_round_key_matrix_linear_part);
    mzd_mul_v_s256_256_1280(&mStack_100,key,precomputed_round_key_matrix_non_linear_part);
    mzd_xor_s256_1280(&mStack_100,&mStack_100,precomputed_constant_non_linear_part);
    bVar4 = 0;
    for (uVar1 = 0; uVar1 != 0x25; uVar1 = uVar1 + 1) {
      sbox_layer_10_uint64(mStack_140.w64 + 3);
      mStack_140.w64[3] =
           mStack_140.w64[3] ^
           *(long *)((long)(&mStack_100)[uVar1 >> 3].w64 + (ulong)(uVar1 & 6) * 4) <<
           (~bVar4 & 0x20) & 0xffffffff00000000U;
      mzd_mul_v_parity_s256_256_30(&mStack_120,&mStack_140,plVar3->z_matrix);
      mzd_shuffle_pext_256_30(&mStack_140,plVar3->r_mask);
      mzd_addmul_v_s256_30_256(&mStack_120,&mStack_140,plVar3->r_matrix);
      mStack_140.w64[3] = mStack_140.w64[3] & 0x3ffffffff;
      mzd_xor_s256_256(&mStack_140,&mStack_120,&mStack_140);
      plVar3 = plVar3 + 1;
      bVar4 = bVar4 + 0x20;
    }
    sbox_layer_10_uint64(mStack_140.w64 + 3);
    mStack_140.w64[3] = mStack_140.w64[3] ^ amStack_80[0].w64[2] & 0xffffffff00000000;
    mzd_mul_v_s256_256(&mStack_120,&mStack_140,Z_r);
    mzd_copy_s256_256(&mStack_140,&mStack_120);
    mzd_copy_s256_256(y,&mStack_140);
    return;
  }
  if (uVar1 == 0x81002b) {
    mStack_e0.w64[3] = 0x10507c;
    mzd_copy_s256_256(&mStack_a0,x);
    mStack_e0.w64[3] = 0x105095;
    mzd_addmul_v_s256_129(&mStack_a0,key,K_0);
    for (lVar2 = 0; (int)lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
      mStack_e0.w64[3] = 0x1050ac;
      sbox_s256_lowmc_129_129_4(&mStack_a0);
      mStack_e0.w64[3] = 0x1050bc;
      mzd_mul_v_s256_129(amStack_80,&mStack_a0,*(mzd_local_t **)((long)&rounds[0].l_matrix + lVar2))
      ;
      mStack_e0.w64[3] = 0x1050cc;
      mzd_xor_s256_256(&mStack_a0,amStack_80,*(mzd_local_t **)((long)&rounds[0].constant + lVar2));
      mStack_e0.w64[3] = 0x1050dc;
      mzd_addmul_v_s256_129(&mStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar2));
    }
    mStack_e0.w64[3] = 0x1050f1;
    mzd_copy_s256_256(pmStack_a8,&mStack_a0);
    return;
  }
  if (uVar1 == 0xc0000a) {
    mStack_140.w64[3] = (word)y;
    mzd_xor_s256_256(&mStack_120,x,precomputed_constant_linear_part);
    plVar3 = rounds;
    mzd_addmul_v_s256_192(&mStack_120,key,precomputed_round_key_matrix_linear_part);
    mzd_mul_v_s256_192_1024(&mStack_e0,key,precomputed_round_key_matrix_non_linear_part);
    mzd_xor_s256_1024(&mStack_e0,&mStack_e0,precomputed_constant_non_linear_part);
    bVar4 = 0;
    for (uVar1 = 0; uVar1 != 0x1d; uVar1 = uVar1 + 1) {
      sbox_layer_10_uint64(mStack_120.w64 + 2);
      mStack_120.w64[2] =
           mStack_120.w64[2] ^
           *(long *)((long)(&mStack_e0)[uVar1 >> 3].w64 + (ulong)(uVar1 & 6) * 4) << (~bVar4 & 0x20)
           & 0xffffffff00000000U;
      mzd_mul_v_parity_uint64_192_30(&mStack_100,&mStack_120,plVar3->z_matrix);
      mzd_shuffle_pext_192_30(&mStack_120,plVar3->r_mask);
      mzd_addmul_v_s256_30_192(&mStack_100,&mStack_120,plVar3->r_matrix);
      mStack_120.w64[2] = mStack_120.w64[2] & 0x3ffffffff;
      mzd_xor_s256_256(&mStack_120,&mStack_100,&mStack_120);
      plVar3 = plVar3 + 1;
      bVar4 = bVar4 + 0x20;
    }
    sbox_layer_10_uint64(mStack_120.w64 + 2);
    mStack_120.w64[2] = mStack_120.w64[2] ^ amStack_80[0].w64[2] & 0xffffffff00000000;
    mzd_mul_v_s256_192(&mStack_100,&mStack_120,Z_r);
    mzd_copy_s256_256(&mStack_120,&mStack_100);
    mzd_copy_s256_256((mzd_local_t *)mStack_140.w64[3],&mStack_120);
    return;
  }
  if (uVar1 != 0xc00040) {
    if (uVar1 != 0xff0055) {
      lowmc_s256_lowmc_128_128_20(key,x,y);
      return;
    }
    mStack_e0.w64[3] = 0x1051de;
    mzd_copy_s256_256(&mStack_a0,x);
    mStack_e0.w64[3] = 0x1051f7;
    mzd_addmul_v_s256_256(&mStack_a0,key,K_0);
    for (lVar2 = 0; (int)lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
      mStack_e0.w64[3] = 0x10520e;
      sbox_s256_lowmc_255_255_4(&mStack_a0);
      mStack_e0.w64[3] = 0x10521e;
      mzd_mul_v_s256_256(amStack_80,&mStack_a0,*(mzd_local_t **)((long)&rounds[0].l_matrix + lVar2))
      ;
      mStack_e0.w64[3] = 0x10522e;
      mzd_xor_s256_256(&mStack_a0,amStack_80,*(mzd_local_t **)((long)&rounds[0].constant + lVar2));
      mStack_e0.w64[3] = 0x10523e;
      mzd_addmul_v_s256_256(&mStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar2));
    }
    mStack_e0.w64[3] = 0x105253;
    mzd_copy_s256_256(pmStack_a8,&mStack_a0);
    return;
  }
  mStack_e0.w64[3] = 0x10512d;
  mzd_copy_s256_256(&mStack_a0,x);
  mStack_e0.w64[3] = 0x105146;
  mzd_addmul_v_s256_192(&mStack_a0,key,K_0);
  for (lVar2 = 0; (int)lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
    mStack_e0.w64[3] = 0x10515d;
    sbox_s256_lowmc_192_192_4(&mStack_a0);
    mStack_e0.w64[3] = 0x10516d;
    mzd_mul_v_s256_192(amStack_80,&mStack_a0,*(mzd_local_t **)((long)&rounds[0].l_matrix + lVar2));
    mStack_e0.w64[3] = 0x10517d;
    mzd_xor_s256_256(&mStack_a0,amStack_80,*(mzd_local_t **)((long)&rounds[0].constant + lVar2));
    mStack_e0.w64[3] = 0x10518d;
    mzd_addmul_v_s256_192(&mStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar2));
  }
  mStack_e0.w64[3] = 0x1051a2;
  mzd_copy_s256_256(pmStack_a8,&mStack_a0);
  return;
}

Assistant:

static inline ATTR_PURE uint32_t lowmc_get_id(const lowmc_parameters_t* lowmc) {
  return LOWMC_ID(lowmc->n, lowmc->m);
}